

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  _Bit_pointer *this_00;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  reference ppFVar4;
  LogMessage *other;
  OneofDescriptor *pOVar5;
  size_t sVar6;
  FileDescriptor *file;
  size_type sVar7;
  ulong uVar8;
  reference ppFVar9;
  value_type this_01;
  string *psVar10;
  FieldGenerator *pFVar11;
  Options *in_RCX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  reference rVar12;
  Iterator IVar13;
  Iterator IVar14;
  string local_368;
  string local_348;
  value_type local_328;
  value_type field_2;
  Iterator __end5;
  Iterator __begin5;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range5;
  value_type oneof;
  Iterator __end4;
  Iterator __begin4;
  OneOfRangeImpl *__range4;
  string local_290;
  reference local_270;
  FieldDescriptor *local_260;
  value_type field_1;
  int i_1;
  vector<bool,_std::allocator<bool>_> processed;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  size_t i;
  string initializer_null;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  byte local_11b;
  LogFinisher local_11a;
  byte local_119;
  undefined1 local_118 [5];
  bool has_arena_constructor;
  FieldDescriptor *local_e0;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  string initializer_with_arena;
  string local_90;
  undefined1 local_70 [8];
  string superclass;
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  Formatter::Formatter((Formatter *)((long)&superclass.field_2 + 8),printer,&this->variables_);
  std::__cxx11::string::string((string *)local_70);
  SuperClassName_abi_cxx11_(&local_90,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX)
  ;
  std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "(arena, is_message_owned)");
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar3) {
    std::__cxx11::string::operator+=((string *)&__range3,",\n  _extensions_(arena)");
  }
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin(&this->optimized_order_);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end(&this->optimized_order_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                     *)&field), bVar2) {
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    local_e0 = *ppFVar4;
    local_119 = 0;
    bVar2 = IsFieldStripped(local_e0,&this->options_);
    if (bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_118,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xbc7);
      local_119 = 1;
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_118,"CHECK failed: !IsFieldStripped(field, options_): "
                        );
      internal::LogFinisher::operator=(&local_11a,other);
    }
    if ((local_119 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)local_118);
    }
    local_11b = FieldDescriptor::is_repeated(local_e0);
    pOVar5 = FieldDescriptor::real_containing_oneof(local_e0);
    if ((pOVar5 == (OneofDescriptor *)0x0) &&
       (((bVar2 = IsLazy(local_e0,&this->options_,this->scc_analyzer_), bVar2 ||
         (bVar2 = IsStringPiece(local_e0,&this->options_), bVar2)) ||
        ((bVar2 = IsString(local_e0,&this->options_), bVar2 &&
         (bVar2 = IsStringInlined(local_e0,&this->options_), bVar2)))))) {
      local_11b = 1;
    }
    if ((local_11b & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_180,",\n  ",&local_181);
      FieldName_abi_cxx11_(&local_1a8,(cpp *)local_e0,field_00);
      std::operator+(&local_160,&local_180,&local_1a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c8,"_(arena)",
                 (allocator *)(initializer_null.field_2._M_local_buf + 0xf));
      std::operator+(&local_140,&local_160,&local_1c8);
      std::__cxx11::string::operator+=((string *)&__range3,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(initializer_null.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  bVar2 = IsAnyMessage(this->descriptor_,&this->options_);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)&__range3,",\n  _any_metadata_(&type_url_, &value_)")
    ;
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::operator+=((string *)&__range3,", _weak_field_map_(arena)");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"()")
  ;
  bVar2 = IsAnyMessage(this->descriptor_,&this->options_);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)&i,", _any_metadata_(&type_url_, &value_)");
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::operator+=((string *)&i,", _weak_field_map_(nullptr)");
  }
  Formatter::operator()
            ((Formatter *)((long)&superclass.field_2 + 8),
             "$classname$::$classname$(::$proto_ns$::Arena* arena,\n                         bool is_message_owned)\n  : $1$ {\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3);
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  if (!bVar2) {
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),"  if (arena != nullptr) {\n");
    for (vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        sVar1 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
        sVar6 = InlinedStringDonatedSize(this), sVar1 < sVar6;
        vars._M_t._M_impl.super__Rb_tree_header._M_node_count =
             vars._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
      Formatter::operator()
                ((Formatter *)((long)&superclass.field_2 + 8),
                 "    _inlined_string_donated_[$1$] = ~0u;\n",
                 &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    Formatter::operator()<>((Formatter *)((long)&superclass.field_2 + 8),"  }\n");
  }
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "  SharedCtor();\n  if (!is_message_owned) {\n    RegisterArenaDtor(arena);\n  }\n");
  }
  Formatter::operator()<>
            ((Formatter *)((long)&superclass.field_2 + 8),
             "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n}\n");
  this_00 = &processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)this_00);
  SetUnknownFieldsVariable
            (this->descriptor_,&this->options_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_00);
  Formatter::AddMap((Formatter *)((long)&superclass.field_2 + 8),
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
  file = Descriptor::file(this->descriptor_);
  bVar2 = UsingImplicitWeakFields(file,&this->options_);
  if (bVar2) {
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "$classname$::$classname$(const $classname$& from)\n  : $classname$() {\n  MergeFrom(from);\n}\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "$classname$::$classname$(const $classname$& from)\n  : $superclass$()");
    Formatter::Indent((Formatter *)((long)&superclass.field_2 + 8));
    Formatter::Indent((Formatter *)((long)&superclass.field_2 + 8));
    Formatter::Indent((Formatter *)((long)&superclass.field_2 + 8));
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (!bVar2) {
      Formatter::operator()<>
                ((Formatter *)((long)&superclass.field_2 + 8),",\n_has_bits_(from._has_bits_)");
    }
    sVar7 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->optimized_order_);
    field_1._7_1_ = 0;
    std::allocator<bool>::allocator((allocator<bool> *)((long)&field_1 + 6));
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&i_1,sVar7,(bool *)((long)&field_1 + 7),
               (allocator<bool> *)((long)&field_1 + 6));
    std::allocator<bool>::~allocator((allocator<bool> *)((long)&field_1 + 6));
    field_1._0_4_ = 0;
    while( true ) {
      uVar8 = (ulong)(int)field_1;
      sVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_);
      if (sVar7 <= uVar8) break;
      ppFVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(long)(int)field_1);
      local_260 = *ppFVar9;
      bVar2 = FieldDescriptor::is_repeated(local_260);
      if (bVar2) {
        bVar2 = FieldDescriptor::is_map(local_260);
        if (bVar2) goto LAB_0051c5e4;
LAB_0051c64e:
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_1,(long)(int)field_1);
        local_270 = rVar12;
        std::_Bit_reference::operator=(&local_270,true);
        FieldName_abi_cxx11_(&local_290,(cpp *)local_260,field_01);
        Formatter::operator()
                  ((Formatter *)((long)&superclass.field_2 + 8),",\n$1$_(from.$1$_)",&local_290);
        std::__cxx11::string::~string((string *)&local_290);
      }
      else {
LAB_0051c5e4:
        bVar2 = IsCord(local_260,&this->options_);
        if (bVar2) goto LAB_0051c64e;
      }
      field_1._0_4_ = (int)field_1 + 1;
    }
    bVar2 = IsAnyMessage(this->descriptor_,&this->options_);
    if (bVar2) {
      Formatter::operator()<>
                ((Formatter *)((long)&superclass.field_2 + 8),
                 ",\n_any_metadata_(&type_url_, &value_)");
    }
    if (0 < this->num_weak_fields_) {
      Formatter::operator()<>
                ((Formatter *)((long)&superclass.field_2 + 8),
                 ",\n_weak_field_map_(from._weak_field_map_)");
    }
    Formatter::Outdent((Formatter *)((long)&superclass.field_2 + 8));
    Formatter::Outdent((Formatter *)((long)&superclass.field_2 + 8));
    Formatter::operator()<>((Formatter *)((long)&superclass.field_2 + 8)," {\n");
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n");
    iVar3 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar3) {
      Formatter::operator()<>
                ((Formatter *)((long)&superclass.field_2 + 8),
                 "_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n");
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&__range4,
               (vector<bool,_std::allocator<bool>_> *)&i_1);
    GenerateConstructorBody(this,printer,(vector<bool,_std::allocator<bool>_> *)&__range4,true);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)&__range4);
    __begin4.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar13 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin4.descriptor);
    __begin4._0_8_ = IVar13.descriptor;
    __end4.descriptor._0_4_ = IVar13.idx;
    IVar13 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin4.descriptor);
    __end4._0_8_ = IVar13.descriptor;
    oneof._0_4_ = IVar13.idx;
    while( true ) {
      bVar2 = cpp::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&oneof);
      if (!bVar2) break;
      this_01 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end4.descriptor);
      psVar10 = OneofDescriptor::name_abi_cxx11_(this_01);
      Formatter::operator()
                ((Formatter *)((long)&superclass.field_2 + 8),
                 "clear_has_$1$();\nswitch (from.$1$_case()) {\n",psVar10);
      Formatter::Indent((Formatter *)((long)&superclass.field_2 + 8));
      __begin5.descriptor =
           (OneofDescriptor *)FieldRange<google::protobuf::OneofDescriptor>(this_01);
      IVar14 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                         ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin5.descriptor)
      ;
      __begin5._0_8_ = IVar14.descriptor;
      __end5.descriptor._0_4_ = IVar14.idx;
      IVar14 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                         ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin5.descriptor)
      ;
      __end5._0_8_ = IVar14.descriptor;
      field_2._0_4_ = IVar14.idx;
      while( true ) {
        bVar2 = cpp::operator!=((Iterator *)&__end5.descriptor,(Iterator *)&field_2);
        if (!bVar2) break;
        local_328 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                              ((Iterator *)&__end5.descriptor);
        psVar10 = FieldDescriptor::name_abi_cxx11_(local_328);
        UnderscoresToCamelCase(&local_348,psVar10,true);
        Formatter::operator()
                  ((Formatter *)((long)&superclass.field_2 + 8),"case k$1$: {\n",&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        Formatter::Indent((Formatter *)((long)&superclass.field_2 + 8));
        bVar2 = IsFieldStripped(local_328,&this->options_);
        if (!bVar2) {
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,local_328);
          (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,printer);
        }
        Formatter::operator()<>((Formatter *)((long)&superclass.field_2 + 8),"break;\n");
        Formatter::Outdent((Formatter *)((long)&superclass.field_2 + 8));
        Formatter::operator()<>((Formatter *)((long)&superclass.field_2 + 8),"}\n");
        FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                  ((Iterator *)&__end5.descriptor);
      }
      psVar10 = OneofDescriptor::name_abi_cxx11_(this_01);
      ToUpper(&local_368,psVar10);
      Formatter::operator()
                ((Formatter *)((long)&superclass.field_2 + 8),"case $1$_NOT_SET: {\n  break;\n}\n",
                 &local_368);
      std::__cxx11::string::~string((string *)&local_368);
      Formatter::Outdent((Formatter *)((long)&superclass.field_2 + 8));
      Formatter::operator()<>((Formatter *)((long)&superclass.field_2 + 8),"}\n");
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end4.descriptor);
    }
    Formatter::Outdent((Formatter *)((long)&superclass.field_2 + 8));
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n}\n\n");
    std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i_1);
  }
  GenerateSharedConstructorCode(this,printer);
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "$classname$::~$classname$() {\n  // @@protoc_insertion_point(destructor:$full_name$)\n  if (GetArenaForAllocation() != nullptr) return;\n  SharedDtor();\n  _internal_metadata_.Delete<$unknown_fields_type$>();\n}\n\n"
              );
  }
  GenerateSharedDestructorCode(this,printer);
  GenerateArenaDestructorCode(this,printer);
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    Formatter::operator()<>
              ((Formatter *)((long)&superclass.field_2 + 8),
               "void $classname$::SetCachedSize(int size) const {\n  _cached_size_.Set(size);\n}\n")
    ;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)&__range3);
  std::__cxx11::string::~string((string *)local_70);
  Formatter::~Formatter((Formatter *)((long)&superclass.field_2 + 8));
  return;
}

Assistant:

void MessageGenerator::GenerateStructors(io::Printer* printer) {
  Formatter format(printer, variables_);

  std::string superclass;
  superclass = SuperClassName(descriptor_, options_);
  std::string initializer_with_arena = superclass + "(arena, is_message_owned)";

  if (descriptor_->extension_range_count() > 0) {
    initializer_with_arena += ",\n  _extensions_(arena)";
  }

  // Initialize member variables with arena constructor.
  for (auto field : optimized_order_) {
    GOOGLE_DCHECK(!IsFieldStripped(field, options_));
    bool has_arena_constructor = field->is_repeated();
    if (!field->real_containing_oneof() &&
        (IsLazy(field, options_, scc_analyzer_) ||
         IsStringPiece(field, options_) ||
         (IsString(field, options_) && IsStringInlined(field, options_)))) {
      has_arena_constructor = true;
    }
    if (has_arena_constructor) {
      initializer_with_arena +=
          std::string(",\n  ") + FieldName(field) + std::string("_(arena)");
    }
  }

  if (IsAnyMessage(descriptor_, options_)) {
    initializer_with_arena += ",\n  _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_with_arena += ", _weak_field_map_(arena)";
  }

  std::string initializer_null = superclass + "()";
  if (IsAnyMessage(descriptor_, options_)) {
    initializer_null += ", _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_null += ", _weak_field_map_(nullptr)";
  }

  format(
      "$classname$::$classname$(::$proto_ns$::Arena* arena,\n"
      "                         bool is_message_owned)\n"
      "  : $1$ {\n",
      initializer_with_arena);

  if (!inlined_string_indices_.empty()) {
    // Donate inline string fields.
    format("  if (arena != nullptr) {\n");
    for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
      format("    _inlined_string_donated_[$1$] = ~0u;\n", i);
    }
    format("  }\n");
  }

  if (!HasSimpleBaseClass(descriptor_, options_)) {
    format(
        "  SharedCtor();\n"
        "  if (!is_message_owned) {\n"
        "    RegisterArenaDtor(arena);\n"
        "  }\n");
  }
  format(
      "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n"
      "}\n");

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Generate the copy constructor.
  if (UsingImplicitWeakFields(descriptor_->file(), options_)) {
    // If we are in lite mode and using implicit weak fields, we generate a
    // one-liner copy constructor that delegates to MergeFrom. This saves some
    // code size and also cuts down on the complexity of implicit weak fields.
    // We might eventually want to do this for all lite protos.
    format(
        "$classname$::$classname$(const $classname$& from)\n"
        "  : $classname$() {\n"
        "  MergeFrom(from);\n"
        "}\n");
  } else {
    format(
        "$classname$::$classname$(const $classname$& from)\n"
        "  : $superclass$()");
    format.Indent();
    format.Indent();
    format.Indent();

    // Do not copy inlined_string_donated_, because this is not an arena
    // constructor.

    if (!has_bit_indices_.empty()) {
      format(",\n_has_bits_(from._has_bits_)");
    }

    std::vector<bool> processed(optimized_order_.size(), false);
    for (int i = 0; i < optimized_order_.size(); i++) {
      auto field = optimized_order_[i];
      if (!(field->is_repeated() && !(field->is_map())) &&
          !IsCord(field, options_)) {
        continue;
      }

      processed[i] = true;
      format(",\n$1$_(from.$1$_)", FieldName(field));
    }

    if (IsAnyMessage(descriptor_, options_)) {
      format(",\n_any_metadata_(&type_url_, &value_)");
    }
    if (num_weak_fields_ > 0) {
      format(",\n_weak_field_map_(from._weak_field_map_)");
    }

    format.Outdent();
    format.Outdent();
    format(" {\n");

    format(
        "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
        "metadata_);\n");

    if (descriptor_->extension_range_count() > 0) {
      format(
          "_extensions_.MergeFrom(internal_default_instance(), "
          "from._extensions_);\n");
    }

    GenerateConstructorBody(printer, processed, true);

    // Copy oneof fields. Oneof field requires oneof case check.
    for (auto oneof : OneOfRange(descriptor_)) {
      format(
          "clear_has_$1$();\n"
          "switch (from.$1$_case()) {\n",
          oneof->name());
      format.Indent();
      for (auto field : FieldRange(oneof)) {
        format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
        format.Indent();
        if (!IsFieldStripped(field, options_)) {
          field_generators_.get(field).GenerateMergingCode(printer);
        }
        format("break;\n");
        format.Outdent();
        format("}\n");
      }
      format(
          "case $1$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          ToUpper(oneof->name()));
      format.Outdent();
      format("}\n");
    }

    format.Outdent();
    format(
        "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n"
        "}\n"
        "\n");
  }

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  if (!HasSimpleBaseClass(descriptor_, options_)) {
    format(
        "$classname$::~$classname$() {\n"
        "  // @@protoc_insertion_point(destructor:$full_name$)\n"
        "  if (GetArenaForAllocation() != nullptr) return;\n"
        "  SharedDtor();\n"
        "  _internal_metadata_.Delete<$unknown_fields_type$>();\n"
        "}\n"
        "\n");
  } else {
    // For messages using simple base classes, having no destructor
    // allows our vtable to share the same destructor as every other
    // message with a simple base class.  This works only as long as
    // we have no fields needing destruction, of course.  (No strings
    // or extensions)
  }

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate the arena-specific destructor code.
  GenerateArenaDestructorCode(printer);

  if (!HasSimpleBaseClass(descriptor_, options_)) {
    // Generate SetCachedSize.
    format(
        "void $classname$::SetCachedSize(int size) const {\n"
        "  _cached_size_.Set(size);\n"
        "}\n");
  }
}